

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

string * __thiscall
Assimp::FBX::FBXConverter::FixAnimMeshName
          (string *__return_storage_ptr__,FBXConverter *this,string *name)

{
  long lVar1;
  ulong uVar2;
  allocator local_29;
  ulong local_28;
  size_t indexOf;
  string *name_local;
  FBXConverter *this_local;
  
  indexOf = (size_t)name;
  name_local = (string *)this;
  this_local = (FBXConverter *)__return_storage_ptr__;
  lVar1 = std::__cxx11::string::length();
  if (((lVar1 == 0) ||
      (uVar2 = std::__cxx11::string::find_first_of((char *)indexOf,0xc52a3e), local_28 = uVar2,
      uVar2 == 0xffffffffffffffff)) || (lVar1 = std::__cxx11::string::size(), lVar1 - 2U <= uVar2))
  {
    lVar1 = std::__cxx11::string::length();
    if (lVar1 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"AnimMesh",&local_29);
      std::allocator<char>::~allocator((allocator<char> *)&local_29);
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)indexOf);
    }
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,indexOf);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FBXConverter::FixAnimMeshName(const std::string& name) {
            if (name.length()) {
                size_t indexOf = name.find_first_of("::");
                if (indexOf != std::string::npos && indexOf < name.size() - 2) {
                    return name.substr(indexOf + 2);
                }
            }
            return name.length() ? name : "AnimMesh";
        }